

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

boolean findtravelpath(_func_boolean_int_int *guess,schar *dx,schar *dy)

{
  char cVar1;
  char cVar2;
  monst *worm;
  bool bVar3;
  boolean bVar4;
  int iVar5;
  uint x0;
  uint y0;
  uint x;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  obj *poVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  uint uVar17;
  permonst *ptr;
  uint y;
  long lVar18;
  undefined1 *puVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  bool bVar25;
  xchar travelstepy [2] [1680];
  xchar travelstepx [2] [1680];
  uint travel [80] [21];
  int local_3564;
  uint local_3560;
  uint local_355c;
  char local_34b8 [3360];
  char local_2798 [3360];
  int local_1a78 [21];
  undefined1 local_1a24 [6644];
  
  if (((guess == (_func_boolean_int_int *)0x0) && (iflags.travel1 != '\0')) &&
     (iVar5 = distmin((int)u.ux,(int)u.uy,(int)u.tx,(int)u.ty), iVar5 == 1)) {
    flags.run = 0;
    bVar4 = test_move((int)u.ux,(int)u.uy,(int)u.tx - (int)u.ux,(int)u.ty - (int)u.uy,0,1);
    if (bVar4 != '\0') {
      *dx = u.tx - u.ux;
      *dy = u.ty - u.uy;
      if (-1 < multi) {
        u._1052_1_ = u._1052_1_ & 0xef;
        u.usleep = 0;
        multi = 0;
        memset(multi_txt,0,0x100);
        flags.run = 0;
        flags.mv = '\0';
        iflags.travel1 = '\0';
        flags.travel = '\0';
      }
      iflags.travelcc.x = -1;
      iflags.travelcc.y = -1;
      return '\x01';
    }
    flags.run = 8;
  }
  if ((u.tx != u.ux) || (guess == unexplored || u.ty != u.uy)) {
    local_355c = (uint)(byte)u.ux;
    if (guess == (_func_boolean_int_int *)0x0) {
      local_355c = (uint)(byte)u.tx;
    }
    uVar20 = (uint)(byte)u.tx;
    local_3560 = (uint)(byte)u.uy;
    uVar23 = (uint)(byte)u.ty;
    if (guess == (_func_boolean_int_int *)0x0) {
      uVar20 = (uint)(byte)u.ux;
      local_3560 = (uint)(byte)u.ty;
      uVar23 = (uint)(byte)u.uy;
    }
    do {
      memset(local_1a78,0,0x1a40);
      x0 = (uint)(char)uVar20;
      y0 = (uint)(char)uVar23;
      uVar17 = 1;
      iVar5 = 1;
      uVar8 = 0;
      local_34b8[0] = (char)local_3560;
      local_2798[0] = (char)local_355c;
      do {
        if ((int)uVar17 < 1) break;
        uVar11 = (ulong)(1 - (int)uVar8);
        uVar9 = (ulong)uVar17;
        uVar13 = 0;
        uVar17 = 0;
        do {
          cVar1 = local_2798[uVar13 + uVar8 * 0x690];
          cVar2 = local_34b8[uVar13 + uVar8 * 0x690];
          lVar21 = (ulong)(u.umonnum != 0x78) * 4 + 4;
          bVar3 = false;
          piVar15 = findtravelpath::ordered;
          do {
            iVar14 = (int)xdir[*piVar15];
            if ((iVar14 + cVar1) - 1U < 0x4f) {
              iVar16 = (int)""[*piVar15];
              y = iVar16 + cVar2;
              if (y < 0x15) {
                x = iVar14 + cVar1;
                uVar12 = (ulong)x;
                if ((guess != couldsee_func) || ((viz_array[y][uVar12] & 1U) != 0)) {
                  worm = level->monsters[uVar12][y];
                  if ((worm == (monst *)0x0) ||
                     (uVar6 = *(uint *)&worm->field_0x60, (uVar6 >> 9 & 1) != 0)) {
LAB_001a9e02:
                    bVar25 = false;
                  }
                  else {
                    if (worm->wormno == '\0') {
                      if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_001a9c2b;
                      if (u.uprops[0x1e].intrinsic == 0) {
                        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a9bcc;
                        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a9bc3;
                      }
                      else {
LAB_001a9bc3:
                        if (ublindf == (obj *)0x0) goto LAB_001a9c78;
LAB_001a9bcc:
                        if (ublindf->oartifact != '\x1d') goto LAB_001a9c78;
                      }
                      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                           (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                          ((viz_array[worm->my][worm->mx] & 1U) != 0)) &&
                         ((worm->data->mflags3 & 0x200) != 0)) goto LAB_001a9c2b;
LAB_001a9c78:
                      if (((worm->data->mflags1 & 0x10000) == 0) &&
                         ((poVar10 = which_armor(worm,4), poVar10 == (obj *)0x0 ||
                          (poVar10 = which_armor(worm,4), poVar10->otyp != 0x4f)))) {
                        if (u.uprops[0x1e].intrinsic == 0) {
                          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a9cd7;
                          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a9cd2;
                        }
                        else {
LAB_001a9cd2:
                          if (ublindf != (obj *)0x0) {
LAB_001a9cd7:
                            if (ublindf->oartifact == '\x1d') goto LAB_001a9d69;
                          }
                          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                          goto LAB_001a9dc8;
                        }
LAB_001a9d69:
                        if ((u.uprops[0x19].extrinsic != 0) &&
                           ((u.uprops[0x19].blocked == 0 &&
                            (iVar7 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy),
                            iVar7 < 0x41)))) goto LAB_001a9dc8;
                      }
                      if ((u.uprops[0x42].intrinsic == 0) &&
                         ((u.uprops[0x42].extrinsic == 0 &&
                          (bVar4 = match_warn_of_mon(worm), bVar4 == '\0')))) goto LAB_001a9e02;
                    }
                    else {
                      bVar4 = worm_known(level,worm);
                      if (bVar4 == '\0') goto LAB_001a9c78;
                      uVar6 = *(uint *)&worm->field_0x60;
LAB_001a9c2b:
                      if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                         (u.uprops[0xc].extrinsic == 0)) {
                        if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                        goto LAB_001a9c6a;
                        goto LAB_001a9c78;
                      }
                      if ((uVar6 & 0x280) != 0) goto LAB_001a9c78;
LAB_001a9c6a:
                      if ((u._1052_1_ & 0x20) != 0) goto LAB_001a9c78;
                    }
LAB_001a9dc8:
                    if (((byte)(worm->m_ap_type - 1) < 2) ||
                       ((ptr = worm->data, (ptr->mflags1 & 0x100) != 0 ||
                        ((char)*(uint *)&worm->field_0x60 < '\0')))) goto LAB_001a9e02;
                    if ((*(uint *)&worm->field_0x60 >> 0x16 & 1) == 0) {
LAB_001a9dee:
                      iVar7 = noattacks(ptr);
                      bVar25 = iVar7 != 0;
                    }
                    else {
                      bVar25 = true;
                      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                        if (u.umonnum != u.umonster) {
                          bVar4 = dmgtype(youmonst.data,0x24);
                          if (bVar4 != '\0') goto LAB_001a9e05;
                          ptr = worm->data;
                        }
                        goto LAB_001a9dee;
                      }
                    }
                  }
LAB_001a9e05:
                  if ((((((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
                         (((youmonst.data)->mflags1 & 8) == 0)) &&
                        (bVar4 = can_ooze(&youmonst), bVar4 == '\0')) &&
                       (bVar4 = closed_door(level,x,y), bVar4 != '\0')) ||
                      ((poVar10 = sobj_at(0x214,level,x,y), (bool)(poVar10 != (obj *)0x0 | bVar25)
                       || (bVar4 = test_move((int)cVar1,(int)cVar2,iVar14,iVar16,0,3), bVar4 != '\0'
                          )))) && (iVar5 + -5 < local_1a78[(long)cVar1 * 0x15 + (long)cVar2])) {
                    if (bVar3) {
                      bVar3 = true;
                    }
                    else {
                      local_2798[(long)(int)uVar17 + uVar11 * 0x690] = cVar1;
                      local_34b8[(long)(int)uVar17 + uVar11 * 0x690] = cVar2;
                      uVar17 = uVar17 + 1;
                      bVar3 = true;
                    }
                  }
                  else {
                    bVar4 = test_move((int)cVar1,(int)cVar2,iVar14,iVar16,0,3);
                    if ((bVar4 != '\0') ||
                       (bVar4 = test_move((int)cVar1,(int)cVar2,iVar14,iVar16,0,2), bVar4 != '\0'))
                    {
                      if (level->locations[uVar12][y].seenv == '\0') {
                        if (u.uprops[0x1e].intrinsic == 0) {
                          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a9f97;
                          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a9f8e;
                        }
                        else {
LAB_001a9f8e:
                          if (ublindf == (obj *)0x0) goto LAB_001aa0c0;
LAB_001a9f97:
                          if (ublindf->oartifact != '\x1d') goto LAB_001aa0c0;
                        }
                        if ((viz_array[y][uVar12] & 1U) == 0) goto LAB_001aa0c0;
                      }
                      if ((x == x0) && (y == y0)) {
                        if (guess == (_func_boolean_int_int *)0x0) {
                          *dx = cVar1 - (char)uVar20;
                          *dy = cVar2 - (char)uVar23;
                          if (cVar1 != u.tx) {
                            return '\x01';
                          }
                          if (cVar2 == u.ty) {
                            if (-1 < multi) {
                              u._1052_1_ = u._1052_1_ & 0xef;
                              u.usleep = 0;
                              multi = 0;
                              memset(multi_txt,0,0x100);
                              flags.mv = '\0';
                              iflags.travel1 = '\0';
                              flags.travel = '\0';
                            }
                            iflags.travelcc.x = -1;
                            iflags.travelcc.y = -1;
                            flags.run = 8;
                            return '\x01';
                          }
                          return '\x01';
                        }
                      }
                      else if (local_1a78[uVar12 * 0x15 + (ulong)y] == 0) {
                        local_2798[(long)(int)uVar17 + uVar11 * 0x690] = (char)x;
                        local_34b8[(long)(int)uVar17 + uVar11 * 0x690] = (char)y;
                        local_1a78[uVar12 * 0x15 + (ulong)y] = iVar5;
                        uVar17 = uVar17 + 1;
                      }
                    }
                  }
                }
              }
            }
LAB_001aa0c0:
            piVar15 = piVar15 + 1;
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar9);
        iVar5 = iVar5 + 1;
        uVar8 = uVar11;
      } while (uVar17 != 0);
      if (guess == (_func_boolean_int_int *)0x0) {
        return '\0';
      }
      local_355c = (uint)(char)local_355c;
      local_3560 = (uint)(char)local_3560;
      iVar5 = distmin(x0,y0,local_355c,local_3560);
      local_3564 = dist2(x0,y0,local_355c,local_3560);
      if (guess == unexplored) {
        local_3564 = 0x7fffffff;
        iVar5 = 0x7fffffff;
      }
      lVar22 = 1;
      lVar21 = 0x13c;
      puVar19 = local_1a24;
      do {
        lVar24 = 0;
        lVar18 = lVar21;
        do {
          iVar14 = *(int *)(puVar19 + lVar24 * 4);
          if (iVar14 != 0) {
            uVar20 = (uint)lVar22;
            uVar23 = (uint)lVar24;
            iVar16 = distmin(x0,y0,uVar20,uVar23);
            if (guess == unexplored) {
              uVar17 = *(uint *)(level->levname + lVar18);
              iVar16 = iVar14;
              if (((uVar17 & 0x3f) != 0x26 && (uVar17 & 0x1ff800) == 0) &&
                 ((0x24 < (uVar17 & 0x3e) || ((0x1500000000U >> (uVar17 & 0x3e) & 1) == 0)))) {
                if (((uVar17 & 0x3f) - 0x1b < 2) ||
                   ((*(uint *)(level->levname + lVar18 + 6) & 0x3f0000) == 0)) {
                  iVar16 = iVar14 * 10;
                }
                else {
                  iVar16 = iVar14 * 2;
                }
              }
            }
            if ((iVar16 == iVar5) && (bVar4 = (*guess)(uVar20,uVar23), bVar4 != '\0')) {
              iVar14 = dist2(x0,y0,uVar20,uVar23);
              if (iVar14 < local_3564) {
                local_3564 = iVar14;
                local_3560 = uVar23;
                local_355c = uVar20;
              }
            }
            else if ((iVar16 < iVar5) && (bVar4 = (*guess)(uVar20,uVar23), bVar4 != '\0')) {
              local_3564 = dist2(x0,y0,uVar20,uVar23);
              local_3560 = uVar23;
              local_355c = uVar20;
              iVar5 = iVar16;
            }
          }
          lVar24 = lVar24 + 1;
          lVar18 = lVar18 + 0xc;
        } while (lVar24 != 0x15);
        lVar22 = lVar22 + 1;
        puVar19 = puVar19 + 0x54;
        lVar21 = lVar21 + 0xfc;
      } while (lVar22 != 0x50);
      uVar20 = (uint)u.ux;
      guess = (_func_boolean_int_int *)0x0;
      uVar23 = (uint)(byte)u.uy;
    } while ((local_355c != uVar20) ||
            (guess = (_func_boolean_int_int *)0x0, local_3560 != (int)u.uy));
    iVar5 = sgn((int)u.tx - local_355c);
    *dx = (schar)iVar5;
    uVar20 = sgn((int)u.ty - (int)u.uy);
    *dy = (char)uVar20;
    if ((*dx == '\0') && ((uVar20 & 0xff) == 0)) {
      if (-1 < multi) {
        u._1052_1_ = u._1052_1_ & 0xef;
        u.usleep = 0;
        multi = 0;
        memset(multi_txt,0,0x100);
        flags.run = 0;
        flags.mv = '\0';
        iflags.travel1 = '\0';
        flags.travel = '\0';
      }
      return '\0';
    }
    bVar4 = test_move((int)u.ux,(int)u.uy,(int)*dx,(int)(char)uVar20,0,1);
    if (bVar4 != '\0') {
      return '\x01';
    }
  }
  *dx = '\0';
  *dy = '\0';
  if (-1 < multi) {
    u._1052_1_ = u._1052_1_ & 0xef;
    u.usleep = 0;
    multi = 0;
    memset(multi_txt,0,0x100);
    flags.run = 0;
    flags.mv = '\0';
    iflags.travel1 = '\0';
    flags.travel = '\0';
  }
  return '\0';
}

Assistant:

static boolean findtravelpath(boolean (*guess)(int, int), schar *dx, schar *dy)
{
    /* if travel to adjacent, reachable location, use normal movement rules */
    if (!guess && iflags.travel1 && distmin(u.ux, u.uy, u.tx, u.ty) == 1) {
	flags.run = 0;
	if (test_move(u.ux, u.uy, u.tx-u.ux, u.ty-u.uy, 0, TEST_MOVE)) {
	    *dx = u.tx-u.ux;
	    *dy = u.ty-u.uy;
	    nomul(0, NULL);
	    iflags.travelcc.x = iflags.travelcc.y = -1;
	    return TRUE;
	}
	flags.run = 8;
    }
    if (u.tx != u.ux || u.ty != u.uy || guess == unexplored) {
	unsigned travel[COLNO][ROWNO];
	xchar travelstepx[2][COLNO*ROWNO];
	xchar travelstepy[2][COLNO*ROWNO];
	xchar tx, ty, ux, uy;
	int n = 1;			/* max offset in travelsteps */
	int set = 0;			/* two sets current and previous */
	int radius = 1;			/* search radius */
	int i;

	/* If guessing, first find an "obvious" goal location.  The obvious
	 * goal is the position the player knows of, or might figure out
	 * (couldsee) that is closest to the target on a straight path.
	 */
	if (guess) {
	    tx = u.ux; ty = u.uy; ux = u.tx; uy = u.ty;
	} else {
	    tx = u.tx; ty = u.ty; ux = u.ux; uy = u.uy;
	}

    noguess:
	memset(travel, 0, sizeof(travel));
	travelstepx[0][0] = tx;
	travelstepy[0][0] = ty;

	while (n != 0) {
	    int nn = 0;

	    for (i = 0; i < n; i++) {
		int dir;
		int x = travelstepx[set][i];
		int y = travelstepy[set][i];
		static const int ordered[] = { 0, 2, 4, 6, 1, 3, 5, 7 };
		/* no diagonal movement for grid bugs */
		int dirmax = u.umonnum == PM_GRID_BUG ? 4 : 8;
		boolean alreadyrepeated = FALSE;

		for (dir = 0; dir < dirmax; ++dir) {
		    const struct monst *mtmp;
		    boolean divert_mon;
		    int nx = x+xdir[ordered[dir]];
		    int ny = y+ydir[ordered[dir]];

		    /*
		     * When guessing and trying to travel as close as possible
		     * to an unreachable target space, don't include spaces
		     * that would never be picked as a guessed target in the
		     * travel matrix describing player-reachable spaces.
		     * This stops travel from getting confused and moving the
		     * player back and forth in certain degenerate configurations
		     * of sight-blocking obstacles, e.g.
		     *
		     *    T         1. Dig this out and carry enough to not be
		     *      ####       able to squeeze through diagonal gaps.
		     *      #--.---    Stand at @ and target travel at space T.
		     *       @.....
		     *       |.....
		     *
		     *    T         2. couldsee() marks spaces marked a and x as
		     *      ####       eligible guess spaces to move the player
		     *      a--.---    towards.  Space a is closest to T, so it gets
		     *       @xxxxx    chosen.  Travel system moves @ right to travel
		     *       |xxxxx    to space a.
		     *
		     *    T         3. couldsee() marks spaces marked b, c and x
		     *      ####       as eligible guess spaces to move the player
		     *      a--c---    towards.  Since findtravelpath() is called
		     *       b@xxxx    repeatedly during travel, it doesn't remember
		     *       |xxxxx    that it wanted to go to space a, so in
		     *                 comparing spaces b and c, b is chosen, since
		     *                 it seems like the closest eligible space to T.
		     *                 Travel system moves @ left to go to space b.
		     *
		     *              4. Go to 2.
		     *
		     * By limiting the travel matrix here, space a in the example
		     * above is never included in it, preventing the cycle.
		     */
		    if (!isok(nx, ny) || (guess == couldsee_func && !guess(nx, ny)))
			continue;

		    /* Walk around monsters that just get in the way. */
		    mtmp = m_at(level, nx, ny);
		    divert_mon = (mtmp &&
				  /* can be seen or spotted */
				  canspotmon(level, mtmp) &&
				  mtmp->m_ap_type != M_AP_FURNITURE &&
				  mtmp->m_ap_type != M_AP_OBJECT &&
				  !(is_hider(mtmp->data) || mtmp->mundetected) &&
				  /* peaceful monsters */
				  ((mtmp->mpeaceful && !Hallucination) ||
				   /* monsters with no attacks */
				   noattacks(mtmp->data)));

		    if ((!Passes_walls && !can_ooze(&youmonst) &&
			 closed_door(level, nx, ny)) ||
			sobj_at(BOULDER, level, nx, ny) ||
			divert_mon ||
			test_move(x, y, nx-x, ny-y, 0, TEST_TRAP)) {
			/* closed doors and boulders usually
			 * cause a delay, so prefer another path */
			if ((int)travel[x][y] > radius-5) {
			    if (!alreadyrepeated) {
				travelstepx[1-set][nn] = x;
				travelstepy[1-set][nn] = y;
				/* don't change travel matrix! */
				nn++;
				alreadyrepeated = TRUE;
			    }
			    continue;
			}
		    }
		    if (test_move(x, y, nx-x, ny-y, 0, TEST_TRAP) ||
			test_move(x, y, nx-x, ny-y, 0, TEST_TRAV)) {
			if (level->locations[nx][ny].seenv ||
			    (!Blind && couldsee(nx, ny))) {
			    if (nx == ux && ny == uy) {
				if (!guess) {
				    *dx = x-ux;
				    *dy = y-uy;
				    if (x == u.tx && y == u.ty) {
					nomul(0, NULL);
					/* reset run so domove run checks work */
					flags.run = 8;
					iflags.travelcc.x = iflags.travelcc.y = -1;
				    }
				    return TRUE;
				}
			    } else if (!travel[nx][ny]) {
				travelstepx[1-set][nn] = nx;
				travelstepy[1-set][nn] = ny;
				travel[nx][ny] = radius;
				nn++;
			    }
			}
		    }
		}
	    }

	    n = nn;
	    set = 1-set;
	    radius++;
	}

	/* if guessing, find best location in travel matrix and go there */
	if (guess) {
	    int px = tx, py = ty;	/* pick location */
	    int dist, nxtdist, d2, nd2;
	    boolean autoexploring = (guess == unexplored);

	    dist = distmin(ux, uy, tx, ty);
	    d2 = dist2(ux, uy, tx, ty);
	    if (autoexploring) {
		dist = INT_MAX;
		d2 = INT_MAX;
	    }
	    for (tx = 1; tx < COLNO; ++tx) {
		for (ty = 0; ty < ROWNO; ++ty) {
		    if (travel[tx][ty]) {
			nxtdist = distmin(ux, uy, tx, ty);
			if (autoexploring)
			    nxtdist = autotravel_weighting(tx, ty, travel[tx][ty]);
			if (nxtdist == dist && guess(tx, ty)) {
			    nd2 = dist2(ux, uy, tx, ty);
			    if (nd2 < d2) {
				/* prefer non-zigzag path */
				px = tx; py = ty;
				d2 = nd2;
			    }
			} else if (nxtdist < dist && guess(tx, ty)) {
			    px = tx; py = ty;
			    dist = nxtdist;
			    d2 = dist2(ux, uy, tx, ty);
			}
		    }
		}
	    }

	    if (px == u.ux && py == u.uy) {
		/* no guesses, just go in the general direction */
		*dx = sgn(u.tx - u.ux);
		*dy = sgn(u.ty - u.uy);
		if (*dx == 0 && *dy == 0) {
		    nomul(0, NULL);
		    return FALSE;
		}
		if (test_move(u.ux, u.uy, *dx, *dy, 0, TEST_MOVE))
		    return TRUE;
		goto found;
	    }
	    tx = px;
	    ty = py;
	    ux = u.ux;
	    uy = u.uy;
	    set = 0;
	    n = radius = 1;
	    guess = NULL;
	    goto noguess;
	}
	return FALSE;
    }

found:
    *dx = 0;
    *dy = 0;
    nomul(0, NULL);
    return FALSE;
}